

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,Texture2D *resultTexture,Texture2D *level0Reference,
          GenMipmapPrecision *precision)

{
  ostringstream *poVar1;
  ostringstream *this;
  pointer pPVar2;
  Texture2D *pTVar3;
  bool bVar4;
  int iVar5;
  GenMipmapPrecision *precision_00;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int local_398;
  qpTestResult local_394;
  allocator<char> local_390;
  allocator<char> local_38f;
  allocator<char> local_38e;
  allocator<char> local_38d;
  undefined4 local_38c;
  GenMipmapPrecision *local_388;
  Texture2D *local_380;
  Surface errorMask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  ConstPixelBufferAccess dst;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Vec4 threshold;
  ConstPixelBufferAccess src;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [384];
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b0,1.0);
  local_388 = precision;
  tcu::select<float,4>
            ((tcu *)&threshold,&precision->colorThreshold,(Vector<float,_4> *)local_1b0,
             &precision->colorMask);
  local_380 = resultTexture;
  bVar4 = tcu::floatThresholdCompare
                    (log,"Level0","Level 0",
                     &((level0Reference->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     &((resultTexture->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     &threshold,COMPARE_LOG_RESULT);
  local_394 = 0;
  if (!bVar4) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"ERROR: Level 0 comparison failed!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  local_394 = (qpTestResult)!bVar4;
  local_398 = 1;
  while( true ) {
    pTVar3 = local_380;
    pPVar2 = (local_380->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_380->super_TextureLevelPyramid).m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x28) <= local_398
       ) break;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&src,&pPVar2[local_398 + -1].super_ConstPixelBufferAccess);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&dst,&(pTVar3->super_TextureLevelPyramid).m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_398].
                     super_ConstPixelBufferAccess);
    tcu::Surface::Surface(&errorMask,dst.m_size.m_data[0],dst.m_size.m_data[1]);
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
    precision_00 = local_388;
    iVar5 = compareGenMipmapBilinear(&dst,&src,(PixelBufferAccess *)local_1b0,local_388);
    local_38c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1);
    if (iVar5 != 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      this = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::operator<<((ostream *)this,"WARNING: Level ");
      std::ostream::operator<<(this,local_398);
      std::operator<<((ostream *)this," comparison to bilinear method failed, found ");
      std::ostream::operator<<(this,iVar5);
      std::operator<<((ostream *)this," invalid pixels.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
      precision_00 = local_388;
      iVar5 = compareGenMipmapBox(&dst,&src,(PixelBufferAccess *)local_1b0,local_388);
      if (iVar5 != 0) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"WARNING: Level ");
        std::ostream::operator<<(poVar1,local_398);
        std::operator<<((ostream *)poVar1," comparison to box method failed, found ");
        std::ostream::operator<<(poVar1,iVar5);
        std::operator<<((ostream *)poVar1," invalid pixels.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        precision_00 = (GenMipmapPrecision *)(ulong)local_394;
        if (local_394 == QP_TEST_RESULT_PASS) {
          precision_00 = (GenMipmapPrecision *)0x2;
        }
        local_394 = (qpTestResult)precision_00;
        tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
        iVar5 = compareGenMipmapVeryLenient(&dst,&src,(PixelBufferAccess *)local_1b0,precision_00);
        if (iVar5 != 0) {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"ERROR: Level ");
          std::ostream::operator<<(poVar1,local_398);
          std::operator<<((ostream *)poVar1," appears to contain ");
          std::ostream::operator<<(poVar1,iVar5);
          std::operator<<((ostream *)poVar1," completely wrong pixels, failing case!");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          local_38c = 0;
          local_394 = QP_TEST_RESULT_FAIL;
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Level",&local_38d);
    de::toString<int>(&local_2d8,&local_398);
    std::operator+(&local_2b8,&local_360,&local_2d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Level ",&local_38e);
    de::toString<int>(&local_298,&local_398);
    std::operator+(&local_1d0,&local_2f8,&local_298);
    std::operator+(&local_278,&local_1d0," result");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&threshold,&local_2b8,&local_278);
    iVar5 = (int)log;
    tcu::LogImageSet::write((LogImageSet *)&threshold,iVar5,__buf,(size_t)precision_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Result",&local_38f);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Result",&local_390);
    access = &dst;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_318,&local_1f0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,iVar5,__buf_00,(size_t)access);
    tcu::LogImage::~LogImage((LogImage *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_318);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&threshold);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_360);
    if ((char)local_38c == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&threshold,"ErrorMask",(allocator<char> *)&local_360);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"Error mask",(allocator<char> *)&local_2d8);
      surface = &errorMask;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,(string *)&threshold,&local_2b8,surface,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b0,iVar5,__buf_01,(size_t)surface);
      tcu::LogImage::~LogImage((LogImage *)local_1b0);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&threshold);
    }
    tcu::TestLog::endImageSet(log);
    tcu::Surface::~Surface(&errorMask);
    local_398 = local_398 + 1;
  }
  return local_394;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::Texture2D& resultTexture, const tcu::Texture2D& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	// Special comparison for level 0.
	{
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log, "Level0", "Level 0", level0Reference.getLevel(0), resultTexture.getLevel(0), threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0 comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevel(levelNdx-1);
		const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevel(levelNdx);
		tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
		bool								levelOk		= false;

		// Try different comparisons in quality order.

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		// At this point all high-quality methods have been used.
		if (!levelOk && result == QP_TEST_RESULT_PASS)
			result = QP_TEST_RESULT_QUALITY_WARNING;

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
			result = QP_TEST_RESULT_FAIL;

		log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx), string("Level ") + de::toString(levelNdx) + " result")
			<< tcu::TestLog::Image("Result", "Result", dst);

		if (!levelOk)
			log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << tcu::TestLog::EndImageSet;
	}

	return result;
}